

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

void __thiscall position::do_move(position *this,Move *m)

{
  info *ifo;
  U64 *pUVar1;
  Color *c;
  U16 *pUVar2;
  Color *pCVar3;
  piece_data *this_00;
  byte bVar4;
  ushort uVar5;
  byte bVar6;
  bool bVar7;
  undefined2 uVar8;
  Color CVar9;
  ulong uVar10;
  U64 UVar11;
  U64 UVar12;
  long lVar13;
  Piece *p_00;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  info *piVar17;
  bool *pbVar18;
  Color them;
  Piece cap;
  Color us;
  Square to;
  Square from;
  Piece p;
  Color local_54;
  Color local_50;
  Color local_4c;
  Square local_48;
  Square local_44;
  Piece local_40;
  Piece local_3c;
  uint local_38;
  Piece local_34;
  
  ifo = &this->ifo;
  UVar11 = this->hidx;
  this->hidx = UVar11 + 1;
  pbVar18 = &this->history[UVar11 - 1].incheck;
  piVar17 = ifo;
  for (lVar13 = 0xc; pbVar18 = pbVar18 + 8, lVar13 != 0; lVar13 = lVar13 + -1) {
    *(U64 *)pbVar18 = piVar17->checkers;
    piVar17 = (info *)piVar17->pinned;
  }
  bVar6 = m->f;
  local_44 = (Square)bVar6;
  bVar4 = m->t;
  local_48 = (Square)bVar4;
  bVar14 = m->type;
  uVar15 = (uint)bVar14;
  local_3c = (this->pcs).piece_on._M_elems[bVar6];
  local_4c = (this->ifo).stm;
  uVar10 = (ulong)local_4c;
  if (local_3c == rook) {
    if (uVar10 == 1) {
      uVar5 = (this->ifo).cmask;
      if ((uVar5 & 0xc) != 0) {
        if (bVar6 == 0x3f) {
          (this->ifo).cmask = uVar5 & 0xb;
          local_54 = black;
          local_50 = CONCAT22(local_50._2_2_,0xb);
          UVar11 = zobrist::castle(&local_54,(U16 *)&local_50);
          pUVar1 = &(this->ifo).key;
          *pUVar1 = *pUVar1 ^ UVar11;
          local_54 = black;
          uVar8 = 0xb;
        }
        else {
          if (bVar6 != 0x38) goto LAB_00120b3f;
          (this->ifo).cmask = uVar5 & 7;
          local_54 = black;
          local_50 = CONCAT22(local_50._2_2_,7);
          UVar11 = zobrist::castle(&local_54,(U16 *)&local_50);
          pUVar1 = &(this->ifo).key;
          *pUVar1 = *pUVar1 ^ UVar11;
          local_54 = black;
          uVar8 = 7;
        }
        goto LAB_00120b24;
      }
    }
    else if ((local_4c == white) && (uVar5 = (this->ifo).cmask, (uVar5 & 3) != 0)) {
      if (local_44 == H1) {
        (this->ifo).cmask = uVar5 & 0xe;
        local_54 = white;
        local_50 = CONCAT22(local_50._2_2_,0xe);
        UVar11 = zobrist::castle(&local_54,(U16 *)&local_50);
        pUVar1 = &(this->ifo).key;
        *pUVar1 = *pUVar1 ^ UVar11;
        local_54 = white;
        uVar8 = 0xe;
      }
      else {
        if (bVar6 != 0) goto LAB_00120b3f;
        (this->ifo).cmask = uVar5 & 0xd;
        local_54 = white;
        local_50 = CONCAT22(local_50._2_2_,0xd);
        UVar11 = zobrist::castle(&local_54,(U16 *)&local_50);
        pUVar1 = &(this->ifo).key;
        *pUVar1 = *pUVar1 ^ UVar11;
        local_54 = white;
        uVar8 = 0xd;
      }
LAB_00120b24:
      local_50 = CONCAT22(local_50._2_2_,uVar8);
      goto LAB_00120b33;
    }
  }
  else if (local_3c == king) {
    (this->pcs).king_sq._M_elems[uVar10] = local_48;
    (this->ifo).ks[uVar10] = (uint)bVar4;
    uVar5 = (this->ifo).cmask;
    if (((uint)(uVar10 == 0) * 3 - 5 | (uint)uVar5) != 0xffffffff) {
      uVar16 = 0xfffffff7;
      if (uVar10 == 0) {
        uVar16 = 0xfffffffd;
      }
      if ((uVar16 | uVar5) != 0xffffffff) goto LAB_00120b3f;
    }
    (this->ifo).cmask = uVar5 & (ushort)(uVar10 == 0) * 9 + 3;
    if (uVar10 == 0) {
      local_50._0_2_ = 0xc;
    }
    else {
      local_50._0_2_ = no_color;
    }
    local_54 = (Color)(uVar10 != 0);
    UVar11 = zobrist::castle(&local_54,(U16 *)&local_50);
    pUVar1 = &(this->ifo).key;
    *pUVar1 = *pUVar1 ^ UVar11;
    if (local_4c == white) {
      local_54 = white;
      local_50 = CONCAT22(local_50._2_2_,0xc);
    }
    else {
      local_54 = black;
      local_50 = CONCAT22(local_50._2_2_,3);
    }
LAB_00120b33:
    UVar11 = zobrist::castle(&local_54,(U16 *)&local_50);
    pUVar1 = &(this->ifo).repkey;
    *pUVar1 = *pUVar1 ^ UVar11;
  }
LAB_00120b3f:
  (this->ifo).captured = no_piece;
  if (uVar15 == 0xc) {
    (this->ifo).captured = pawn;
    local_54 = local_4c ^ black;
    local_50 = (local_48 + (uint)(local_4c == black) * 0x10) - 8;
    local_40 = pawn;
    piece_data::remove_piece(&this->pcs,&local_54,&local_40,&local_50,ifo);
    local_40 = pawn;
    p_00 = &local_40;
  }
  else if (uVar15 == 0xb) {
    (this->ifo).captured = (this->pcs).piece_on._M_elems[local_48];
    local_54 = local_4c ^ black;
    local_50 = (this->pcs).piece_on._M_elems[local_48];
    piece_data::remove_piece(&this->pcs,&local_54,&local_50,&local_48,ifo);
    p_00 = &local_3c;
  }
  else {
    if (uVar15 != 10) {
      if (bVar14 < 4) {
        if (uVar15 == 0) {
          local_50 = 4;
        }
        else if (uVar15 == 1) {
          local_50 = no_color;
        }
        else {
          local_50 = (uVar15 == 2) + black;
        }
        local_54 = white;
        piece_data::remove_piece(&this->pcs,&local_4c,&local_54,&local_44,ifo);
        piece_data::add_piece(&this->pcs,&local_4c,&local_50,&local_48,ifo);
      }
      else if (bVar14 < 8) {
        (this->ifo).captured = (this->pcs).piece_on._M_elems[local_48];
        this_00 = &this->pcs;
        if (uVar15 == 4) {
          local_34 = queen;
        }
        else if (uVar15 == 5) {
          local_34 = rook;
        }
        else {
          local_34 = (uVar15 == 6) + knight;
        }
        local_54 = local_4c ^ black;
        local_50 = (this->pcs).piece_on._M_elems[local_48];
        local_38 = uVar15;
        piece_data::remove_piece(this_00,&local_54,&local_50,&local_48,ifo);
        local_40 = pawn;
        piece_data::remove_piece(this_00,&local_4c,&local_40,&local_44,ifo);
        piece_data::add_piece(this_00,&local_4c,&local_34,&local_48,ifo);
        bVar14 = (byte)local_38;
      }
      else {
        if (uVar15 == 9) {
          local_54 = 0x38;
          if (local_4c == white) {
            local_54 = white;
          }
          CVar9 = no_color;
          local_50 = 0x3b;
        }
        else {
          if (uVar15 != 8) goto LAB_00120c5d;
          local_54 = 0x3f;
          if (local_4c == white) {
            local_54 = 7;
          }
          CVar9 = 5;
          local_50 = 0x3d;
        }
        if (local_4c == white) {
          local_50 = CVar9;
        }
        local_40 = king;
        piece_data::do_quiet(&this->pcs,&local_4c,&local_40,&local_44,&local_48,ifo);
        local_40 = rook;
        piece_data::do_quiet(&this->pcs,&local_4c,&local_40,&local_54,&local_50,ifo);
        pUVar2 = &(this->ifo).cmask;
        *pUVar2 = *pUVar2 & (ushort)((ulong)local_4c == 0) * 9 + 3;
        (this->ifo).has_castled[local_4c] = true;
      }
      goto LAB_00120c5d;
    }
    p_00 = &local_3c;
  }
  piece_data::do_quiet(&this->pcs,&local_4c,p_00,&local_44,&local_48,ifo);
LAB_00120c5d:
  c = &(this->ifo).stm;
  (this->ifo).eps = no_square;
  if ((local_3c == pawn) && (((local_44 - local_48) + 0x10 & 0xffffffdf) == 0)) {
    (this->ifo).eps = (local_44 + (uint)(local_4c == white) * 0x10) - A2;
    local_54 = CONCAT31(local_54._1_3_,(char)local_48) & 0xffffff07;
    UVar11 = zobrist::ep((U8 *)&local_54);
    pUVar1 = &(this->ifo).key;
    *pUVar1 = *pUVar1 ^ UVar11;
    local_54 = CONCAT31(local_54._1_3_,(undefined1)local_48) & 0xffffff07;
    UVar11 = zobrist::ep((U8 *)&local_54);
    pUVar1 = &(this->ifo).repkey;
    *pUVar1 = *pUVar1 ^ UVar11;
  }
  UVar11 = 0;
  uVar10 = (ulong)(byte)((this->ifo).move50 + 1);
  if (bVar14 == 0xb) {
    uVar10 = UVar11;
  }
  bVar6 = (byte)uVar10;
  if (local_3c == pawn) {
    bVar6 = 0;
  }
  (this->ifo).move50 = bVar6;
  local_54 = CONCAT22(local_54._2_2_,(ushort)bVar6);
  UVar12 = zobrist::mv50((U16 *)&local_54);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar12;
  pUVar2 = &(this->ifo).hmvs;
  *pUVar2 = *pUVar2 + 1;
  UVar12 = zobrist::hmvs(&(this->ifo).hmvs);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar12;
  pCVar3 = &(this->ifo).stm;
  *(undefined1 *)pCVar3 = (char)*pCVar3 ^ black;
  UVar12 = zobrist::stm(c);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar12;
  UVar12 = zobrist::stm(c);
  pUVar1 = &(this->ifo).repkey;
  *pUVar1 = *pUVar1 ^ UVar12;
  local_54 = (this->ifo).ks[(this->ifo).stm];
  bVar7 = is_attacked(this,&local_54,c,&local_4c,0);
  (this->ifo).incheck = bVar7;
  if (bVar7) {
    CVar9 = (this->ifo).stm;
    local_54 = (this->ifo).ks[CVar9];
    local_50 = CVar9 ^ black;
    UVar11 = attackers_of2(this,&local_54,&local_50);
  }
  (this->ifo).checkers = UVar11;
  CVar9 = (this->ifo).stm;
  UVar11 = pinned(this,CVar9);
  (this->ifo).pinned[CVar9] = UVar11;
  UVar11 = pinned(this,(Color)((long)(int)CVar9 ^ 1U));
  (this->ifo).pinned[(long)(int)CVar9 ^ 1U] = UVar11;
  this->nodes_searched = this->nodes_searched + 1;
  return;
}

Assistant:

void position::do_move(const Move& m) {
	history[hidx++] = ifo;
	const Square from = Square(m.f);
	const Square to = Square(m.t);
	const Movetype t = Movetype(m.type);
	const Piece p = piece_on(from);
	const Color us = to_move();

	// king square update and castle rights update
	if (p == king) {
		pcs.king_sq[us] = to;
		ifo.ks[us] = to;
		if (can_castle_ks() || can_castle_qs()) {
			ifo.cmask &= (us == white ? clearw : clearb);
			ifo.key ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
			ifo.repkey ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
		}
	}
	else if (p == rook) {
		if (us == white && can_castle<white>()) {
			if (from == A1) {
				ifo.cmask &= clearwqs;
				ifo.key ^= zobrist::castle(white, clearwqs);
				ifo.repkey ^= zobrist::castle(white, clearwqs);
			}
			else if (from == H1) {
				ifo.cmask &= clearwks;
				ifo.key ^= zobrist::castle(white, clearwks);
				ifo.repkey ^= zobrist::castle(white, clearwks);
			}
		}
		else if (us == black && can_castle<black>()) {
			if (from == A8) {
				ifo.cmask &= clearbqs;
				ifo.key ^= zobrist::castle(black, clearbqs);
				ifo.repkey ^= zobrist::castle(black, clearbqs);
			}
			else if (from == H8) {
				ifo.cmask &= clearbks;
				ifo.key ^= zobrist::castle(black, clearbks);
				ifo.repkey ^= zobrist::castle(black, clearbks);
			}
		}
	}

	ifo.captured = no_piece;

	if (t == quiet) {
		pcs.do_quiet(us, p, from, to, ifo);
	}

	else if (t == capture) {
		ifo.captured = piece_on(to);
		pcs.do_cap(us, p, from, to, ifo);
	}

	else if (t == ep) {
		ifo.captured = pawn;
		pcs.do_ep(us, from, to, ifo);
	}

	else if (t < capture_promotion_q) pcs.do_promotion(us, (t == promotion_q ? queen :
		t == promotion_r ? rook :
		t == promotion_b ? bishop :
		knight), from, to, ifo);

	else if (t < castle_ks) {
		ifo.captured = piece_on(to);
		pcs.do_promotion_cap(us, (t == capture_promotion_q ? queen :
			t == capture_promotion_r ? rook :
			t == capture_promotion_b ? bishop :
			knight), from, to, ifo);
	}

	else if (t == castle_ks) {
		pcs.do_castle_ks(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	else if (t == castle_qs) {
		pcs.do_castle_qs(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	// eps
	ifo.eps = no_square;
	if (p == pawn && abs(from - to) == 16) {
		ifo.eps = Square(from + (us == white ? 8 : -8));
		ifo.key ^= zobrist::ep(util::col(to));
		ifo.repkey ^= zobrist::ep(util::col(to));
	}

	// move50
	if (p == pawn || t == capture) ifo.move50 = 0;
	else ifo.move50++;
	ifo.key ^= zobrist::mv50(ifo.move50);

	// half-moves
	ifo.hmvs++;
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// side to move
	ifo.stm = Color(ifo.stm ^ 1);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	ifo.incheck = is_attacked(king_square(), ifo.stm, us);
	ifo.checkers = (ifo.incheck ? attackers_of2(king_square(), Color(ifo.stm ^ 1)) : 0ULL);
	ifo.pinned[ifo.stm] = pinned(ifo.stm);
	ifo.pinned[ifo.stm ^ 1] = pinned(Color(ifo.stm ^ 1));
	++nodes_searched;
}